

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMarkAsAdvancedCommand.cxx
# Opt level: O2

bool __thiscall
cmMarkAsAdvancedCommand::InitialPass
          (cmMarkAsAdvancedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  ulong uVar2;
  bool bVar3;
  undefined7 extraout_var;
  cmState *this_00;
  char *pcVar4;
  cmake *this_01;
  undefined8 extraout_RAX;
  ulong uVar5;
  string *key;
  allocator<char> local_92;
  allocator<char> local_91;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  ulong local_88;
  cmCommand *local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  local_90 = args;
  local_80 = &this->super_cmCommand;
  if (__lhs == (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"called with incorrect number of arguments",
               (allocator<char> *)&local_50);
    cmCommand::SetError(local_80,&local_70);
  }
  else {
    bVar3 = std::operator==(__lhs,"CLEAR");
    if ((bVar3) ||
       (bVar3 = std::operator==((local_90->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start,"FORCE"), bVar3)) {
      bVar3 = std::operator==((local_90->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start,"CLEAR");
      local_78 = "1";
      if (bVar3) {
        local_78 = "0";
      }
      local_88 = CONCAT71(extraout_var,1);
      uVar5 = 1;
    }
    else {
      local_78 = "1";
      uVar5 = 0;
      local_88 = 0;
    }
    while( true ) {
      pbVar1 = (local_90->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_90->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar5) {
        return true;
      }
      key = pbVar1 + uVar5;
      this_00 = cmMakefile::GetState(local_80->Makefile);
      pcVar4 = cmState::GetCacheEntryValue(this_00,key);
      if (pcVar4 == (char *)0x0) {
        this_01 = cmMakefile::GetCMakeInstance(local_80->Makefile);
        cmake::AddCacheEntry(this_01,key,(char *)0x0,(char *)0x0,6);
        local_88 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      pcVar4 = cmState::GetCacheEntryValue(this_00,key);
      if (pcVar4 == (char *)0x0) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"ADVANCED",(allocator<char> *)&local_50);
      pcVar4 = cmState::GetCacheEntryProperty(this_00,key,&local_70);
      uVar2 = local_88;
      std::__cxx11::string::~string((string *)&local_70);
      if (pcVar4 == (char *)0x0 || (uVar2 & 1) != 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"ADVANCED",&local_91)
        ;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,local_78,&local_92);
        cmState::SetCacheEntryProperty(this_00,key,&local_70,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"This should never happen...",(allocator<char> *)&local_50);
    cmSystemTools::Error(&local_70);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return false;
}

Assistant:

bool cmMarkAsAdvancedCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  unsigned int i = 0;
  const char* value = "1";
  bool overwrite = false;
  if (args[0] == "CLEAR" || args[0] == "FORCE") {
    overwrite = true;
    if (args[0] == "CLEAR") {
      value = "0";
    }
    i = 1;
  }
  for (; i < args.size(); ++i) {
    std::string const& variable = args[i];
    cmState* state = this->Makefile->GetState();
    if (!state->GetCacheEntryValue(variable)) {
      this->Makefile->GetCMakeInstance()->AddCacheEntry(
        variable, nullptr, nullptr, cmStateEnums::UNINITIALIZED);
      overwrite = true;
    }
    if (!state->GetCacheEntryValue(variable)) {
      cmSystemTools::Error("This should never happen...");
      return false;
    }
    if (!state->GetCacheEntryProperty(variable, "ADVANCED") || overwrite) {
      state->SetCacheEntryProperty(variable, "ADVANCED", value);
    }
  }
  return true;
}